

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

nhdp_laddr * nhdp_db_link_addr_add(nhdp_link *lnk,netaddr *addr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint8_t uVar4;
  nhdp_laddr *ptr;
  
  ptr = (nhdp_laddr *)oonf_class_malloc(&_laddr_info);
  if (ptr != (nhdp_laddr *)0x0) {
    uVar4 = addr->_prefix_len;
    (ptr->link_addr)._type = addr->_type;
    (ptr->link_addr)._prefix_len = uVar4;
    uVar1 = *(undefined4 *)(addr->_addr + 4);
    uVar2 = *(undefined4 *)(addr->_addr + 8);
    uVar3 = *(undefined4 *)(addr->_addr + 0xc);
    *(undefined4 *)(ptr->link_addr)._addr = *(undefined4 *)addr->_addr;
    *(undefined4 *)((ptr->link_addr)._addr + 4) = uVar1;
    *(undefined4 *)((ptr->link_addr)._addr + 8) = uVar2;
    *(undefined4 *)((ptr->link_addr)._addr + 0xc) = uVar3;
    (ptr->_link_node).key = ptr;
    (ptr->_neigh_node).key = ptr;
    (ptr->_if_node).key = ptr;
    ptr->link = lnk;
    avl_insert(&lnk->_addresses,&ptr->_link_node);
    avl_insert(&lnk->neigh->_link_addresses,&ptr->_neigh_node);
    avl_insert(&ptr->link->local_if->_link_addresses,&ptr->_if_node);
    oonf_class_event(&_laddr_info,ptr,OONF_OBJECT_ADDED);
  }
  return ptr;
}

Assistant:

struct nhdp_laddr *
nhdp_db_link_addr_add(struct nhdp_link *lnk, const struct netaddr *addr) {
  struct nhdp_laddr *laddr;

  laddr = oonf_class_malloc(&_laddr_info);
  if (laddr == NULL) {
    return NULL;
  }

  /* initialize key */
  memcpy(&laddr->link_addr, addr, sizeof(laddr->link_addr));
  laddr->_link_node.key = &laddr->link_addr;
  laddr->_neigh_node.key = &laddr->link_addr;
  laddr->_if_node.key = &laddr->link_addr;

  /* initialize back link */
  laddr->link = lnk;

  /* add to trees */
  avl_insert(&lnk->_addresses, &laddr->_link_node);
  avl_insert(&lnk->neigh->_link_addresses, &laddr->_neigh_node);
  nhdp_interface_add_laddr(laddr);

  /* trigger event */
  oonf_class_event(&_laddr_info, laddr, OONF_OBJECT_ADDED);

  return laddr;
}